

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentLocals.cpp
# Opt level: O2

Pass * wasm::createInstrumentLocalsPass(void)

{
  InstrumentLocals *this;
  
  this = (InstrumentLocals *)operator_new(0x110);
  memset(this,0,0x110);
  InstrumentLocals::InstrumentLocals(this);
  return (Pass *)this;
}

Assistant:

Pass* createInstrumentLocalsPass() { return new InstrumentLocals(); }